

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int nextStronghold(StrongholdIter *sh,Generator *g)

{
  Pos *pPVar1;
  int iVar2;
  uint64_t value;
  Pos PVar3;
  long in_RSI;
  Pos *in_RDI;
  double dVar4;
  uint64_t in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  Generator *in_stack_00000028;
  uint64_t lbr;
  uint64_t *in_stack_00000048;
  int i;
  uint64_t validM;
  uint64_t validB;
  undefined8 in_stack_ffffffffffffff88;
  Pos *in_stack_ffffffffffffff90;
  Pos local_38;
  int local_2c;
  ulong local_28;
  ulong local_20;
  long local_18;
  Pos *local_10;
  
  local_20 = 0;
  local_28 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_2c = 0; pPVar1 = local_10, local_2c < 0x40; local_2c = local_2c + 1) {
    iVar2 = isStrongholdBiome((int)in_stack_ffffffffffffff90,
                              (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (iVar2 != 0) {
      local_20 = 1L << ((byte)local_2c & 0x3f) | local_20;
    }
    iVar2 = isStrongholdBiome((int)in_stack_ffffffffffffff90,
                              (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (iVar2 != 0) {
      local_28 = 1L << ((byte)local_2c & 0x3f) | local_28;
    }
  }
  if (local_10[7].x < 0x18) {
    if (local_10[7].x < 2) {
      return 0;
    }
    in_stack_ffffffffffffff90 = local_10 + 6;
    PVar3 = locateBiome(in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_0000001c,
                        in_stack_00000018,in_stack_00000010,lbr,in_stack_00000048,(int *)validM);
    *pPVar1 = PVar3;
  }
  else if (local_18 == 0) {
    nextLong((uint64_t *)in_stack_ffffffffffffff90);
    *local_10 = local_10[1];
  }
  else {
    local_38 = local_10[6];
    value = nextLong((uint64_t *)in_stack_ffffffffffffff90);
    setSeed((uint64_t *)&local_38,value);
    pPVar1 = local_10;
    in_stack_ffffffffffffff90 = &local_38;
    PVar3 = locateBiome(in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_0000001c,
                        in_stack_00000018,in_stack_00000010,lbr,in_stack_00000048,(int *)validM);
    *pPVar1 = PVar3;
  }
  local_10->x = (local_10->x & 0xfffffff0U) + 4;
  local_10->z = (local_10->z & 0xfffffff0U) + 4;
  local_10[3].z = local_10[3].z + 1;
  local_10[4] = (Pos)(6.283185307179586 / (double)local_10[3].x + (double)local_10[4]);
  if (local_10[3].z == local_10[3].x) {
    local_10[2].z = local_10[2].z + 1;
    local_10[3].z = 0;
    local_10[3].x = local_10[3].x + (local_10[3].x << 1) / (local_10[2].z + 1);
    if (0x80 - local_10[2].x < local_10[3].x) {
      local_10[3].x = 0x80 - local_10[2].x;
    }
    dVar4 = nextDouble((uint64_t *)in_stack_ffffffffffffff90);
    local_10[4] = (Pos)(dVar4 * 3.141592653589793 + dVar4 * 3.141592653589793 + (double)local_10[4])
    ;
  }
  if (local_10[7].x < 0xc) {
    dVar4 = nextDouble((uint64_t *)in_stack_ffffffffffffff90);
    local_10[5] = (Pos)((dVar4 + 1.25) * 32.0);
  }
  else {
    iVar2 = local_10[2].z;
    dVar4 = nextDouble((uint64_t *)in_stack_ffffffffffffff90);
    local_10[5] = (Pos)((dVar4 - 0.5) * 32.0 * 2.5 + (double)iVar2 * 6.0 * 32.0 + 128.0);
  }
  dVar4 = cos((double)local_10[4]);
  dVar4 = round(dVar4 * (double)local_10[5]);
  local_10[1].x = (int)dVar4 * 0x10 + 8;
  dVar4 = sin((double)local_10[4]);
  dVar4 = round(dVar4 * (double)local_10[5]);
  local_10[1].z = (int)dVar4 * 0x10 + 8;
  local_10[2].x = local_10[2].x + 1;
  iVar2 = 3;
  if (0xb < local_10[7].x) {
    iVar2 = 0x80;
  }
  return iVar2 - (local_10[2].x + -1);
}

Assistant:

int nextStronghold(StrongholdIter *sh, const Generator *g)
{
    uint64_t validB = 0, validM = 0;
    int i;
    for (i = 0; i < 64; i++)
    {
        if (isStrongholdBiome(sh->mc, i))
            validB |= (1ULL << i);
        if (isStrongholdBiome(sh->mc, i+128))
            validM |= (1ULL << i);
    }

    if (sh->mc > MC_1_19_2)
    {
        if (g)
        {
            uint64_t lbr = sh->rnds;
            setSeed(&lbr, nextLong(&sh->rnds));
            sh->pos = locateBiome(g, sh->nextapprox.x, 0, sh->nextapprox.z, 112,
                validB, validM, &lbr, NULL);
        }
        else
        {
            nextLong(&sh->rnds);
            sh->pos = sh->nextapprox;
        }
    }
    else if (sh->mc >= MC_B1_8)
    {
        sh->pos = locateBiome(g, sh->nextapprox.x, 0, sh->nextapprox.z, 112,
            validB, validM, &sh->rnds, NULL);
    }
    else
    {
        return 0;
    }
    // staircase is located at (4, 4) in chunk
    sh->pos.x = (sh->pos.x & ~15) + 4;
    sh->pos.z = (sh->pos.z & ~15) + 4;

    sh->ringidx++;
    sh->angle += 2 * PI / sh->ringmax;

    if (sh->ringidx == sh->ringmax)
    {
        sh->ringnum++;
        sh->ringidx = 0;
        sh->ringmax = sh->ringmax + 2*sh->ringmax / (sh->ringnum+1);
        if (sh->ringmax > 128-sh->index)
            sh->ringmax = 128-sh->index;
        sh->angle += nextDouble(&sh->rnds) * PI * 2.0;
    }

    if (sh->mc >= MC_1_9)
    {
        sh->dist = (4.0 * 32.0) + (6.0 * sh->ringnum * 32.0) +
            (nextDouble(&sh->rnds) - 0.5) * 32 * 2.5;
    }
    else
    {
        sh->dist = (1.25 + nextDouble(&sh->rnds)) * 32.0;
    }

    sh->nextapprox.x = ((int)round(cos(sh->angle) * sh->dist) * 16) + 8;
    sh->nextapprox.z = ((int)round(sin(sh->angle) * sh->dist) * 16) + 8;
    sh->index++;

    return (sh->mc >= MC_1_9 ? 128 : 3) - (sh->index-1);
}